

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O1

void loadNodeBuffer(void)

{
  GLboolean GVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nodeIDs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  bintree::precomputeNodes(&local_20,&g_bintree);
  GVar1 = (*glad_glIsBuffer)(g_gl.nodeBuffer);
  if (GVar1 != '\0') {
    (*glad_glDeleteBuffers)(1,(GLuint *)0x1f618c);
  }
  (*glad_glGenBuffers)(1,(GLuint *)0x1f618c);
  (*glad_glBindBuffer)(0x90d2,g_gl.nodeBuffer);
  (*glad_glBufferData)
            (0x90d2,(long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
             local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  (*glad_glBindBuffer)(0x90d2,0);
  (*glad_glBindBufferBase)(0x90d2,0,g_gl.nodeBuffer);
  if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void loadNodeBuffer()
{
    const std::vector<uint32_t> nodeIDs = g_bintree.precomputeNodes();

    if (glIsBuffer(g_gl.nodeBuffer))
        glDeleteBuffers(1, &g_gl.nodeBuffer);
    glGenBuffers(1, &g_gl.nodeBuffer);
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, g_gl.nodeBuffer);
    glBufferData(GL_SHADER_STORAGE_BUFFER,
                 sizeof(nodeIDs[0]) * nodeIDs.size(),
                 &nodeIDs[0],
                 GL_STATIC_DRAW);
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
    glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, g_gl.nodeBuffer);
}